

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::pprint::Indent_abi_cxx11_(string *__return_storage_ptr__,pprint *this,uint32_t n)

{
  uint local_1a4;
  stringstream local_1a0 [4];
  uint32_t i;
  stringstream ss;
  ostream aoStack_190 [380];
  uint local_14;
  string *psStack_10;
  uint32_t n_local;
  
  local_14 = (uint)this;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  for (local_1a4 = 0; local_1a4 < local_14; local_1a4 = local_1a4 + 1) {
    std::operator<<(aoStack_190,(string *)sIndentString_abi_cxx11_);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Indent(uint32_t n) {
  std::stringstream ss;

  for (uint32_t i = 0; i < n; i++) {
    ss << sIndentString;
  }

  return ss.str();
}